

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Filter * __thiscall
helics::Federate::registerFilter
          (Federate *this,string_view filterName,string_view inputType,string_view outputType)

{
  string_view addition;
  Filter *pFVar1;
  unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  in_stack_00000070;
  undefined1 in_stack_00000078 [16];
  undefined1 in_stack_00000088 [16];
  _Any_data in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Federate *this_01;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  this_01 = (Federate *)&stack0x00000008;
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                *)0x352782);
  addition._M_str = in_stack_ffffffffffffff68;
  addition._M_len = in_stack_ffffffffffffff60;
  localNameGenerator_abi_cxx11_(this_01,addition);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this_01->currentMode;
  pFVar1 = ConnectorFederateManager::registerFilter
                     ((ConnectorFederateManager *)
                      in_stack_00000070._M_t.
                      super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                      .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>.
                      _M_head_impl,(string_view)in_stack_00000088,(string_view)in_stack_00000078,
                      (string_view)in_stack_000000a0);
  std::__cxx11::string::~string(this_00);
  return pFVar1;
}

Assistant:

Filter& Federate::registerFilter(std::string_view filterName,
                                 std::string_view inputType,
                                 std::string_view outputType)
{
    return cManager->registerFilter(localNameGenerator(filterName), inputType, outputType);
}